

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Var * __thiscall wabt::Var::operator=(Var *this,Var *rhs)

{
  char *pcVar1;
  size_type sVar2;
  undefined8 uVar3;
  
  pcVar1 = (rhs->loc).filename.data_;
  sVar2 = (rhs->loc).filename.size_;
  uVar3 = *(undefined8 *)((long)&(rhs->loc).field_1 + 8);
  (this->loc).field_1.field_1.offset = (rhs->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar3;
  (this->loc).filename.data_ = pcVar1;
  (this->loc).filename.size_ = sVar2;
  if (rhs->type_ == Index) {
    set_index(this,(rhs->field_2).index_);
  }
  else {
    set_name(this,*(string_view *)&rhs->field_2);
  }
  return this;
}

Assistant:

Var& Var::operator=(Var&& rhs) {
  loc = rhs.loc;
  if (rhs.is_index()) {
    set_index(rhs.index_);
  } else {
    set_name(rhs.name_);
  }
  return *this;
}